

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collationiterator.cpp
# Opt level: O3

UBool __thiscall
icu_63::CollationIterator::CEBuffer::ensureAppendCapacity
          (CEBuffer *this,int32_t appCap,UErrorCode *errorCode)

{
  long *__dest;
  UBool UVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  
  uVar4 = this->length;
  uVar3 = (this->buffer).capacity;
  UVar1 = '\x01';
  if ((int)uVar3 < (int)(appCap + uVar4)) {
    if (*errorCode < U_ILLEGAL_ARGUMENT_ERROR) {
      do {
        uVar2 = uVar3;
        uVar3 = uVar2 << ((int)uVar2 < 1000) + 1;
      } while ((int)uVar3 < (int)(appCap + uVar4));
      if ((0 < (int)uVar2) &&
         (__dest = (long *)uprv_malloc_63((ulong)uVar3 << 3), __dest != (long *)0x0)) {
        if (0 < (int)uVar4) {
          uVar2 = (this->buffer).capacity;
          if ((int)uVar2 < (int)uVar4) {
            uVar4 = uVar2;
          }
          if ((int)uVar3 <= (int)uVar4) {
            uVar4 = uVar3;
          }
          memcpy(__dest,(this->buffer).ptr,(long)(int)uVar4 << 3);
        }
        if ((this->buffer).needToRelease != '\0') {
          uprv_free_63((this->buffer).ptr);
        }
        (this->buffer).ptr = __dest;
        (this->buffer).capacity = uVar3;
        (this->buffer).needToRelease = '\x01';
        return '\x01';
      }
      *errorCode = U_MEMORY_ALLOCATION_ERROR;
    }
    UVar1 = '\0';
  }
  return UVar1;
}

Assistant:

UBool
CollationIterator::CEBuffer::ensureAppendCapacity(int32_t appCap, UErrorCode &errorCode) {
    int32_t capacity = buffer.getCapacity();
    if((length + appCap) <= capacity) { return TRUE; }
    if(U_FAILURE(errorCode)) { return FALSE; }
    do {
        if(capacity < 1000) {
            capacity *= 4;
        } else {
            capacity *= 2;
        }
    } while(capacity < (length + appCap));
    int64_t *p = buffer.resize(capacity, length);
    if(p == NULL) {
        errorCode = U_MEMORY_ALLOCATION_ERROR;
        return FALSE;
    }
    return TRUE;
}